

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O0

void Rml::Context::SendEvents
               (ElementSet *old_items,ElementSet *new_items,EventId id,Dictionary *parameters)

{
  bool bVar1;
  ObserverPtr *this;
  Element *this_00;
  ObserverPtr<Rml::Element> *element;
  iterator __end1;
  iterator __begin1;
  ElementObserverList *__range1;
  ElementObserverListBackInserter local_68;
  __normal_iterator<Rml::Element_*const_*,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
  local_60;
  __normal_iterator<Rml::Element_*const_*,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
  local_58;
  __normal_iterator<Rml::Element_*const_*,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
  local_50;
  __normal_iterator<Rml::Element_*const_*,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
  local_48;
  undefined1 local_40 [8];
  ElementObserverList elements;
  Dictionary *parameters_local;
  EventId id_local;
  ElementSet *new_items_local;
  ElementSet *old_items_local;
  
  elements.
  super__Vector_base<Rml::ObserverPtr<Rml::Element>,_std::allocator<Rml::ObserverPtr<Rml::Element>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)parameters;
  ::std::vector<Rml::ObserverPtr<Rml::Element>,_std::allocator<Rml::ObserverPtr<Rml::Element>_>_>::
  vector((vector<Rml::ObserverPtr<Rml::Element>,_std::allocator<Rml::ObserverPtr<Rml::Element>_>_> *
         )local_40);
  local_48._M_current =
       (Element **)
       itlib::
       flat_set<Rml::Element_*,_itlib::fsimpl::less,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
       ::begin(old_items);
  local_50._M_current =
       (Element **)
       itlib::
       flat_set<Rml::Element_*,_itlib::fsimpl::less,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
       ::end(old_items);
  local_58._M_current =
       (Element **)
       itlib::
       flat_set<Rml::Element_*,_itlib::fsimpl::less,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
       ::begin(new_items);
  local_60._M_current =
       (Element **)
       itlib::
       flat_set<Rml::Element_*,_itlib::fsimpl::less,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
       ::end(new_items);
  ElementObserverListBackInserter::ElementObserverListBackInserter
            (&local_68,
             (vector<Rml::ObserverPtr<Rml::Element>,_std::allocator<Rml::ObserverPtr<Rml::Element>_>_>
              *)local_40);
  ::std::
  set_difference<__gnu_cxx::__normal_iterator<Rml::Element*const*,std::vector<Rml::Element*,std::allocator<Rml::Element*>>>,__gnu_cxx::__normal_iterator<Rml::Element*const*,std::vector<Rml::Element*,std::allocator<Rml::Element*>>>,Rml::ElementObserverListBackInserter>
            (local_48,local_50,local_58,local_60,local_68);
  __end1 = ::std::
           vector<Rml::ObserverPtr<Rml::Element>,_std::allocator<Rml::ObserverPtr<Rml::Element>_>_>
           ::begin((vector<Rml::ObserverPtr<Rml::Element>,_std::allocator<Rml::ObserverPtr<Rml::Element>_>_>
                    *)local_40);
  element = (ObserverPtr<Rml::Element> *)
            ::std::
            vector<Rml::ObserverPtr<Rml::Element>,_std::allocator<Rml::ObserverPtr<Rml::Element>_>_>
            ::end((vector<Rml::ObserverPtr<Rml::Element>,_std::allocator<Rml::ObserverPtr<Rml::Element>_>_>
                   *)local_40);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Rml::ObserverPtr<Rml::Element>_*,_std::vector<Rml::ObserverPtr<Rml::Element>,_std::allocator<Rml::ObserverPtr<Rml::Element>_>_>_>
                                     *)&element), bVar1) {
    this = (ObserverPtr *)
           __gnu_cxx::
           __normal_iterator<Rml::ObserverPtr<Rml::Element>_*,_std::vector<Rml::ObserverPtr<Rml::Element>,_std::allocator<Rml::ObserverPtr<Rml::Element>_>_>_>
           ::operator*(&__end1);
    bVar1 = ObserverPtr::operator_cast_to_bool(this);
    if (bVar1) {
      this_00 = ObserverPtr<Rml::Element>::operator->((ObserverPtr<Rml::Element> *)this);
      Element::DispatchEvent
                (this_00,id,
                 (Dictionary *)
                 elements.
                 super__Vector_base<Rml::ObserverPtr<Rml::Element>,_std::allocator<Rml::ObserverPtr<Rml::Element>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    __gnu_cxx::
    __normal_iterator<Rml::ObserverPtr<Rml::Element>_*,_std::vector<Rml::ObserverPtr<Rml::Element>,_std::allocator<Rml::ObserverPtr<Rml::Element>_>_>_>
    ::operator++(&__end1);
  }
  ::std::vector<Rml::ObserverPtr<Rml::Element>,_std::allocator<Rml::ObserverPtr<Rml::Element>_>_>::
  ~vector((vector<Rml::ObserverPtr<Rml::Element>,_std::allocator<Rml::ObserverPtr<Rml::Element>_>_>
           *)local_40);
  return;
}

Assistant:

void Context::SendEvents(const ElementSet& old_items, const ElementSet& new_items, EventId id, const Dictionary& parameters)
{
	// We put our elements in observer pointers in case some of them are deleted during dispatch.
	ElementObserverList elements;
	std::set_difference(old_items.begin(), old_items.end(), new_items.begin(), new_items.end(), ElementObserverListBackInserter(elements));
	for (auto& element : elements)
	{
		if (element)
			element->DispatchEvent(id, parameters);
	}
}